

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  CookieInfo *pCVar4;
  long lVar5;
  bool bVar6;
  
  pCVar4 = inc;
  if (inc == (CookieInfo *)0x0) {
    pCVar4 = (CookieInfo *)(*Curl_ccalloc)(1,0x28);
    if (pCVar4 == (CookieInfo *)0x0) {
      return (CookieInfo *)0x0;
    }
    pcVar2 = "none";
    if (file != (char *)0x0) {
      pcVar2 = file;
    }
    pcVar2 = (*Curl_cstrdup)(pcVar2);
    pCVar4->filename = pcVar2;
    if (pcVar2 == (char *)0x0) {
      bVar6 = true;
      __stream = (FILE *)0x0;
      pcVar2 = (char *)0x0;
      goto LAB_0010d223;
    }
  }
  pCVar4->running = false;
  bVar6 = true;
  if (file == (char *)0x0) {
LAB_0010d08a:
    __stream = (FILE *)0x0;
  }
  else {
    iVar1 = strcmp(file,"-");
    if (iVar1 == 0) {
      bVar6 = false;
      __stream = _stdin;
    }
    else {
      if (*file == '\0') goto LAB_0010d08a;
      __stream = fopen64(file,"r");
    }
  }
  pCVar4->newsession = newsession;
  if (__stream == (FILE *)0x0) {
    pCVar4->running = true;
    return pCVar4;
  }
  pcVar2 = (char *)(*Curl_cmalloc)(5000);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = fgets(pcVar2,5000,__stream);
    if (pcVar2 == (char *)0x0) {
      lVar5 = 3;
    }
    else {
      sVar3 = strlen(pcVar2);
      lVar5 = 0;
      if ((sVar3 != 0) && (pcVar2[sVar3 - 1] == '\n')) {
        lVar5 = 1;
      }
    }
    pCVar4 = (CookieInfo *)(*(code *)((long)&DAT_001476f4 + (long)(int)(&DAT_001476f4)[lVar5]))();
    return pCVar4;
  }
LAB_0010d223:
  (*Curl_cfree)(pcVar2);
  if (inc == (CookieInfo *)0x0) {
    Curl_cookie_cleanup(pCVar4);
  }
  if (__stream != (FILE *)0x0 && bVar6) {
    fclose(__stream);
  }
  return (CookieInfo *)0x0;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp = NULL;
  bool fromfile=TRUE;
  char *line = NULL;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
    if(!c->filename)
      goto fail; /* failed to get memory */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && !strcmp(file, "-")) {
    fp = stdin;
    fromfile=FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, FOPEN_READTEXT):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    line = malloc(MAX_COOKIE_LINE);
    if(!line)
      goto fail;
    while(get_line(line, MAX_COOKIE_LINE, fp)) {
      if(checkprefix("Set-Cookie:", line)) {
        /* This is a cookie line, get it! */
        lineptr=&line[11];
        headerline=TRUE;
      }
      else {
        lineptr=line;
        headerline=FALSE;
      }
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;

      Curl_cookie_add(data, c, headerline, lineptr, NULL, NULL);
    }
    free(line); /* free the line buffer */

    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */

  return c;

fail:
  free(line);
  if(!inc)
    /* Only clean up if we allocated it here, as the original could still be in
     * use by a share handle */
    Curl_cookie_cleanup(c);
  if(fromfile && fp)
    fclose(fp);
  return NULL; /* out of memory */
}